

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_lengthi<char,char>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  bool bVar1;
  jessilib *pjVar2;
  jessilib *extraout_RDX;
  char *pcVar4;
  jessilib *this;
  char *pcVar5;
  jessilib *this_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  decode_result dVar6;
  decode_result dVar7;
  char *local_48;
  char *local_40;
  size_t sVar3;
  
  local_40 = in_prefix._M_str;
  pjVar2 = (jessilib *)in_prefix._M_len;
  pcVar4 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (this < pjVar2) {
    local_48 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)0x0;
    for (this_00 = pjVar2; (this != (jessilib *)0x0 && (this_00 != (jessilib *)0x0));
        this_00 = this_00 + -sVar3) {
      in_string_00._M_str = (char *)pjVar2;
      in_string_00._M_len = (size_t)pcVar4;
      dVar6 = decode_codepoint_utf8<char>(this,in_string_00);
      in_string_01._M_str = (char *)dVar6.units;
      in_string_01._M_len = (size_t)local_40;
      dVar7 = decode_codepoint_utf8<char>(this_00,in_string_01);
      sVar3 = dVar7.units;
      if (in_string_01._M_str == (char *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (sVar3 == 0) {
        return (size_t)(char *)0x0;
      }
      bVar1 = equalsi(dVar6.codepoint,dVar7.codepoint);
      if (!bVar1) {
        return (size_t)(char *)0x0;
      }
      pcVar4 = pcVar4 + (long)in_string_01._M_str;
      this = this + -(long)in_string_01._M_str;
      local_40 = local_40 + sVar3;
      pcVar5 = pcVar5 + (long)in_string_01._M_str;
      pjVar2 = extraout_RDX;
    }
    local_48 = (char *)0x0;
    if (this_00 == (jessilib *)0x0) {
      local_48 = pcVar5;
    }
  }
  return (size_t)local_48;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}